

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

void __thiscall
nv::FloatImage::applyKernelVertical
          (FloatImage *this,PolyphaseKernel *k,int x,uint c,uint a,WrapMode wm,float *output)

{
  ulong uVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  float *pfVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  uVar12 = (ulong)k->m_length;
  if (uVar12 != 0) {
    uVar6 = k->m_windowSize;
    uVar3 = this->m_height;
    iVar15 = (uint)this->m_width * (uint)uVar3;
    fVar2 = k->m_width;
    pfVar7 = this->m_mem;
    iVar13 = 0;
    if (0 < x) {
      iVar13 = x;
    }
    uVar21 = 0;
    do {
      fVar23 = ((float)(uVar21 & 0xffffffff) + 0.5) * (1.0 / ((float)uVar12 / (float)uVar3));
      fVar24 = floorf(fVar23 - fVar2);
      fVar23 = ceilf(fVar23 + fVar2);
      if (((int)uVar6 < (int)fVar23 - (int)fVar24) &&
         (iVar9 = nvAbort("right - left <= windowSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                          ,0x348,
                          "void nv::FloatImage::applyKernelVertical(const PolyphaseKernel &, int, uint, uint, WrapMode, float *__restrict) const"
                         ), iVar9 == 1)) {
        raise(5);
      }
      fVar23 = NAN;
      if (0 < (int)uVar6) {
        uVar4 = this->m_height;
        uVar19 = uVar4 - 1;
        uVar5 = this->m_width;
        iVar16 = uVar5 - 1;
        iVar9 = iVar13;
        if (iVar16 < iVar13) {
          iVar9 = iVar16;
        }
        uVar11 = x;
        if (uVar5 == 1) {
          uVar11 = 0;
        }
        uVar8 = -uVar11;
        if (0 < (int)uVar11) {
          uVar8 = uVar11;
        }
        fVar23 = 0.0;
        uVar22 = 0;
        fVar25 = 0.0;
        do {
          uVar1 = uVar22 + (long)(int)fVar24;
          uVar20 = (uint)uVar5;
          uVar11 = (uint)uVar1;
          uVar18 = (uint)uVar4;
          if (wm == WrapMode_Repeat) {
            if ((long)uVar1 < 0) {
              uVar14 = (int)(uVar11 + 1) % (int)uVar18 + uVar19;
            }
            else {
              uVar14 = (uint)((uVar1 & 0xffffffff) % (ulong)uVar4);
            }
            if (x < 0) {
              uVar17 = (x + 1) % (int)(uint)uVar5 + iVar16;
            }
            else {
              uVar17 = (uint)x % uVar20;
            }
LAB_001c7c43:
            iVar10 = uVar14 * uVar20 + uVar17;
          }
          else {
            uVar17 = uVar8;
            if (wm != WrapMode_Clamp) {
              while (uVar20 <= uVar17) {
                uVar14 = ((uVar5 - 2) + (uint)uVar5) - uVar17;
                uVar17 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar17 = uVar14;
                }
              }
              if (uVar18 == 1) {
                uVar11 = 0;
              }
              uVar14 = -uVar11;
              if (0 < (int)uVar11) {
                uVar14 = uVar11;
              }
              while (uVar18 <= uVar14) {
                uVar11 = ((uVar4 - 2) + (uint)uVar4) - uVar14;
                uVar14 = -uVar11;
                if (0 < (int)uVar11) {
                  uVar14 = uVar11;
                }
              }
              goto LAB_001c7c43;
            }
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if ((int)uVar19 < (int)uVar11) {
              uVar11 = uVar19;
            }
            iVar10 = uVar11 * uVar20 + iVar9;
          }
          fVar26 = (pfVar7[(ulong)(iVar15 * a) + (long)iVar10] + 0.00390625) *
                   k->m_data[(uint)(k->m_windowSize * (int)uVar21 + (int)uVar22)];
          fVar25 = fVar25 + fVar26;
          fVar23 = fVar23 + fVar26 * pfVar7[(ulong)(c * iVar15) + (long)iVar10];
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar6);
        fVar23 = fVar23 / fVar25;
      }
      output[uVar21] = fVar23;
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar12);
  }
  return;
}

Assistant:

void FloatImage::applyKernelVertical(const PolyphaseKernel & k, int x, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_height);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvCheck(right - left <= windowSize);
		
		float norm = 0;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(x, j+left, wm);
			
			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}